

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall YAML::Parser::HandleDirective(Parser *this,Token *token)

{
  bool bVar1;
  
  bVar1 = std::operator==(&token->value,"YAML");
  if (bVar1) {
    HandleYamlDirective(this,token);
    return;
  }
  bVar1 = std::operator==(&token->value,"TAG");
  if (bVar1) {
    HandleTagDirective(this,token);
    return;
  }
  return;
}

Assistant:

void Parser::HandleDirective(const Token& token) {
  if (token.value == "YAML") {
    HandleYamlDirective(token);
  } else if (token.value == "TAG") {
    HandleTagDirective(token);
  }
}